

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

void __thiscall
minibag::View::addQuery
          (View *this,Bag *bag,function<bool_(const_minibag::ConnectionInfo_*)> *query,
          Time *start_time,Time *end_time)

{
  BagMode BVar1;
  BagQuery *this_00;
  BagException *this_01;
  BagQuery *local_68;
  Query local_60;
  
  BVar1 = Bag::getMode(bag);
  if ((BVar1 & Read) != 0) {
    this_00 = (BagQuery *)operator_new(0x40);
    Query::Query(&local_60,query,start_time,end_time);
    BagQuery::BagQuery(this_00,bag,&local_60,bag->bag_revision_);
    local_68 = this_00;
    std::vector<minibag::BagQuery*,std::allocator<minibag::BagQuery*>>::
    emplace_back<minibag::BagQuery*>
              ((vector<minibag::BagQuery*,std::allocator<minibag::BagQuery*>> *)&this->queries_,
               &local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_60);
    updateQueries(this,(this->queries_).
                       super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]);
    return;
  }
  this_01 = (BagException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Bag not opened for reading",(allocator<char> *)&local_68);
  BagException::BagException(this_01,(string *)&local_60);
  __cxa_throw(this_01,&BagException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void View::addQuery(Bag const& bag, std::function<bool(ConnectionInfo const*)> query, miniros::Time const& start_time, miniros::Time const& end_time) {
    if ((bag.getMode() & bagmode::Read) != bagmode::Read)
        throw BagException("Bag not opened for reading");

    queries_.push_back(new BagQuery(&bag, Query(query, start_time, end_time), bag.bag_revision_));

    updateQueries(queries_.back());
}